

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O1

void cmExtraEclipseCDT4Generator::AppendIncludeDirectories
               (cmXMLWriter *xml,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *includeDirs,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *emittedDirs)

{
  bool bVar1;
  iterator iVar2;
  pointer pbVar3;
  pointer in_path;
  string dir;
  RegularExpression frameworkRx;
  string local_2c0;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_2a0;
  string local_298;
  pointer local_278;
  cmXMLWriter *local_270;
  _Base_ptr local_268;
  RegularExpression local_260;
  
  in_path = (includeDirs->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (includeDirs->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (in_path != pbVar3) {
    local_268 = &(emittedDirs->_M_t)._M_impl.super__Rb_tree_header._M_header;
    local_2a0 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                 *)emittedDirs;
    local_278 = pbVar3;
    local_270 = xml;
    do {
      if (in_path->_M_string_length != 0) {
        cmsys::SystemTools::CollapseFullPath(&local_298,in_path);
        local_260.regmust = (char *)0x0;
        local_260.program = (char *)0x0;
        local_260.progsize = 0;
        memset(&local_260,0,0x20a);
        cmsys::RegularExpression::compile(&local_260,"(.+/Frameworks)/.+\\.framework/");
        bVar1 = cmsys::RegularExpression::find
                          (&local_260,local_298._M_dataplus._M_p,&local_260.regmatch);
        if (bVar1) {
          if (local_260.regmatch.startp[1] == (char *)0x0) {
            local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
            local_2c0._M_string_length = 0;
            local_2c0.field_2._M_local_buf[0] = '\0';
          }
          else {
            local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_2c0,local_260.regmatch.startp[1],local_260.regmatch.endp[1])
            ;
          }
          std::__cxx11::string::operator=((string *)&local_298,(string *)&local_2c0);
          xml = local_270;
          pbVar3 = local_278;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
            operator_delete(local_2c0._M_dataplus._M_p,
                            CONCAT71(local_2c0.field_2._M_allocated_capacity._1_7_,
                                     local_2c0.field_2._M_local_buf[0]) + 1);
            xml = local_270;
            pbVar3 = local_278;
          }
        }
        iVar2 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_2a0,&local_298);
        if (iVar2._M_node == local_268) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>(local_2a0,&local_298);
          local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"pathentry","");
          cmXMLWriter::StartElement(xml,&local_2c0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
            operator_delete(local_2c0._M_dataplus._M_p,
                            CONCAT71(local_2c0.field_2._M_allocated_capacity._1_7_,
                                     local_2c0.field_2._M_local_buf[0]) + 1);
          }
          local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2c0,local_298._M_dataplus._M_p,
                     local_298._M_dataplus._M_p + local_298._M_string_length);
          cmXMLWriter::Attribute<std::__cxx11::string>(xml,"include",&local_2c0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
            operator_delete(local_2c0._M_dataplus._M_p,
                            CONCAT71(local_2c0.field_2._M_allocated_capacity._1_7_,
                                     local_2c0.field_2._M_local_buf[0]) + 1);
          }
          cmXMLWriter::Attribute<char[4]>(xml,"kind",(char (*) [4])0x827bc3);
          cmXMLWriter::Attribute<char[1]>(xml,"path",(char (*) [1])0x8618f5);
          cmXMLWriter::Attribute<char[5]>(xml,"system",(char (*) [5])0x84a502);
          cmXMLWriter::EndElement(xml);
        }
        if (local_260.program != (char *)0x0) {
          operator_delete__(local_260.program);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
        }
      }
      in_path = in_path + 1;
    } while (in_path != pbVar3);
  }
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::AppendIncludeDirectories(
  cmXMLWriter& xml, const std::vector<std::string>& includeDirs,
  std::set<std::string>& emittedDirs)
{
  for (std::string const& inc : includeDirs) {
    if (!inc.empty()) {
      std::string dir = cmSystemTools::CollapseFullPath(inc);

      // handle framework include dirs on OSX, the remainder after the
      // Frameworks/ part has to be stripped
      //   /System/Library/Frameworks/GLUT.framework/Headers
      cmsys::RegularExpression frameworkRx("(.+/Frameworks)/.+\\.framework/");
      if (frameworkRx.find(dir)) {
        dir = frameworkRx.match(1);
      }

      if (emittedDirs.find(dir) == emittedDirs.end()) {
        emittedDirs.insert(dir);
        xml.StartElement("pathentry");
        xml.Attribute("include",
                      cmExtraEclipseCDT4Generator::GetEclipsePath(dir));
        xml.Attribute("kind", "inc");
        xml.Attribute("path", "");
        xml.Attribute("system", "true");
        xml.EndElement();
      }
    }
  }
}